

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.cpp
# Opt level: O3

Span<int> __thiscall
Potassco::SmodelsConvert::SmData::mapLits<int>
          (SmData *this,Span<int> *in,vector<int,_std::allocator<int>_> *out)

{
  Atom_t AVar1;
  iterator __position;
  Atom_t a;
  uint uVar2;
  undefined8 in_RAX;
  Atom *pAVar3;
  pointer piVar4;
  pointer piVar5;
  pointer piVar6;
  pointer piVar7;
  Atom_t *pAVar8;
  Span<int> SVar9;
  undefined8 uStack_38;
  
  piVar5 = (out->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((out->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
      != piVar5) {
    (out->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish =
         piVar5;
  }
  piVar7 = piVar5;
  if (in->size != 0) {
    pAVar8 = (Atom_t *)in->first;
    uStack_38 = in_RAX;
    do {
      AVar1 = *pAVar8;
      a = -AVar1;
      if (0 < (int)AVar1) {
        a = AVar1;
      }
      pAVar3 = mapAtom(this,a);
      uVar2 = -((uint)*pAVar3 & 0xfffffff);
      if (-1 < (int)AVar1) {
        uVar2 = (uint)*pAVar3 & 0xfffffff;
      }
      uStack_38 = CONCAT44(uVar2,(undefined4)uStack_38);
      __position._M_current =
           (out->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
      if (__position._M_current ==
          (out->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (out,__position,(int *)((long)&uStack_38 + 4));
      }
      else {
        *__position._M_current = uVar2;
        (out->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_finish = __position._M_current + 1;
      }
      pAVar8 = pAVar8 + 1;
    } while (pAVar8 != (Atom_t *)(in->first + in->size));
    piVar7 = (out->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start;
    piVar5 = (out->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_finish;
  }
  piVar4 = piVar7;
  if ((long)piVar5 - (long)piVar7 == 0) {
    piVar4 = (pointer)0x0;
  }
  piVar6 = (pointer)((long)piVar5 - (long)piVar7 >> 2);
  if (piVar5 == piVar7) {
    piVar6 = (pointer)0x0;
  }
  SVar9.size = (size_t)piVar6;
  SVar9.first = piVar4;
  return SVar9;
}

Assistant:

Span<T>  mapLits(const Span<T>& in, std::vector<T>& out) {
		out.clear();
		for (typename Span<T>::iterator x = begin(in); x != end(in); ++x) { out.push_back(mapLit(*x)); }
		return toSpan(out);
	}